

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O0

void __thiscall
optimization::loop_expand::Const_Loop_Expand::optimize_func
          (Const_Loop_Expand *this,MirFunction *func)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  size_t sVar4;
  pointer pIVar5;
  loop_info *in_RSI;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3;
  int times;
  mapped_type *blk;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> vars;
  int size;
  optional<optimization::loop_expand::loop_info> info;
  BasicBlk *startblk;
  MirFunction *in_stack_00000498;
  loop_info *in_stack_000008f0;
  BasicBlk *in_stack_000008f8;
  MirFunction *in_stack_00000900;
  loop_info *in_stack_fffffffffffffe68;
  loop_info *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  MirFunction *in_stack_fffffffffffffe90;
  loop_info local_140;
  loop_info *in_stack_ffffffffffffff10;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_e0;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_d8;
  int local_cc;
  int local_c8;
  mapped_type *local_b8;
  int local_7c;
  _Base_ptr local_20;
  BasicBlk *local_18;
  loop_info *local_10;
  
  local_10 = in_RSI;
  local_20 = (_Base_ptr)
             std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      *)in_stack_fffffffffffffe68);
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1e2a7d);
  local_18 = &ppVar3->second;
  do {
    find_loop_start(in_stack_00000498);
    bVar1 = std::optional<optimization::loop_expand::loop_info>::has_value
                      ((optional<optimization::loop_expand::loop_info> *)0x1e2aab);
    if (!bVar1) {
      return;
    }
    sVar4 = mir::inst::MirFunction::variable_table_size(in_stack_fffffffffffffe90);
    local_7c = (int)sVar4;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1e2ad5);
    std::optional<optimization::loop_expand::loop_info>::operator->
              ((optional<optimization::loop_expand::loop_info> *)0x1e2af3);
    std::
    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
    ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
          *)in_stack_fffffffffffffe90,
         (key_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    local_b8 = std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)in_stack_fffffffffffffe90,
                    (key_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::optional<optimization::loop_expand::loop_info>::operator->
              ((optional<optimization::loop_expand::loop_info> *)0x1e2b3b);
    local_c8 = loop_info::get_times(in_stack_ffffffffffffff10);
    if (local_c8 < 0x40) {
      local_d8 = &local_b8->inst;
      local_e0._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)in_stack_fffffffffffffe68);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)in_stack_fffffffffffffe68);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffffe70,
                                (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffffe68), bVar1) {
        in_stack_ffffffffffffff10 =
             (loop_info *)
             __gnu_cxx::
             __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
             ::operator*(&local_e0);
        pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1e2c12);
        iVar2 = (*(pIVar5->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 != 7) {
          in_stack_fffffffffffffe90 = (MirFunction *)&(local_10->phi_var).id;
          in_stack_fffffffffffffe8c = local_c8;
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1e2c58)
          ;
          std::
          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                *)in_stack_fffffffffffffe90,
               (key_type_conflict *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          in_stack_fffffffffffffe88 =
               mir::inst::Variable::size((Variable *)in_stack_fffffffffffffe70);
          local_7c = in_stack_fffffffffffffe8c * in_stack_fffffffffffffe88 + local_7c;
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator++(&local_e0);
      }
      in_stack_fffffffffffffe70 = local_10;
      std::optional<optimization::loop_expand::loop_info>::value
                ((optional<optimization::loop_expand::loop_info> *)local_10);
      in_stack_fffffffffffffe68 = &local_140;
      loop_info::loop_info(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      expand_loop(in_stack_00000900,in_stack_000008f8,in_stack_000008f0);
      local_cc = 0;
    }
    else {
      local_cc = 3;
    }
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1e2d19);
  } while (local_cc == 0);
  return;
}

Assistant:

void Const_Loop_Expand::optimize_func(mir::inst::MirFunction& func) {
  auto& startblk = func.basic_blks.begin()->second;
  while (true) {
    auto info = find_loop_start(func);
    if (!info.has_value()) {
      break;
    }
    int size = func.variable_table_size();
    std::set<mir::inst::VarId> vars;
    auto& blk =
        func.basic_blks.at(func.basic_blks.at(info->loop_start).jump.bb_true);

    int times = info->get_times();
    if (times >= 64) {
      break;
    }
    for (auto& inst : blk.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Phi) {
        continue;
      }
      size += times * func.variables.at(inst->dest.id).size();
    }

    // if (size >= 1024) {
    //   return;
    // }
    expand_loop(func, blk, info.value());
  }
}